

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_123::LimitedInputStream::decreaseLimit
          (LimitedInputStream *this,uint64_t amount,uint64_t requested)

{
  bool bVar1;
  char (*params) [36];
  String local_210;
  Exception local_1f8;
  Fault local_58;
  Fault f;
  undefined1 local_48 [8];
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition;
  uint64_t requested_local;
  uint64_t amount_local;
  LimitedInputStream *this_local;
  
  _kjCondition._32_8_ = requested;
  requested_local = amount;
  amount_local = (uint64_t)this;
  f.exception = (Exception *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this->limit);
  kj::_::DebugExpression<unsigned_long&>::operator>=
            ((DebugComparison<unsigned_long_&,_unsigned_long_&> *)local_48,
             (DebugExpression<unsigned_long&> *)&f,&requested_local);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_48);
  if (bVar1) {
    params = (char (*) [36])(this->limit - requested_local);
    this->limit = (uint64_t)params;
    if (this->limit == 0) {
      Own<kj::AsyncInputStream,_std::nullptr_t>::operator=(&this->inner,(void *)0x0);
    }
    else if (requested_local < (ulong)_kjCondition._32_8_) {
      kj::_::Debug::makeDescription<char_const(&)[36]>
                (&local_210,(Debug *)"\"fixed-length pipe ended prematurely\"",
                 "fixed-length pipe ended prematurely",params);
      Exception::Exception
                (&local_1f8,DISCONNECTED,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                 ,0x69f,&local_210);
      throwRecoverableException(&local_1f8,0);
      Exception::~Exception(&local_1f8);
      String::~String(&local_210);
    }
    return;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&>
            (&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,0x699,FAILED,"limit >= amount","_kjCondition,",
             (DebugComparison<unsigned_long_&,_unsigned_long_&> *)local_48);
  kj::_::Debug::Fault::fatal(&local_58);
}

Assistant:

void decreaseLimit(uint64_t amount, uint64_t requested) {
    KJ_ASSERT(limit >= amount);
    limit -= amount;
    if (limit == 0) {
      inner = nullptr;
    } else if (amount < requested) {
      kj::throwRecoverableException(KJ_EXCEPTION(DISCONNECTED,
          "fixed-length pipe ended prematurely"));
    }
  }